

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

QStringList * __thiscall
QProcess::splitCommand(QStringList *__return_storage_ptr__,QProcess *this,QStringView command)

{
  QChar ch;
  bool bVar1;
  int iVar2;
  bool bVar3;
  QProcess *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.size = 0;
  pQVar4 = (QProcess *)0x0;
  if ((long)this < 1) {
    this = pQVar4;
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  bVar3 = false;
  iVar2 = 0;
  do {
    if (this == pQVar4) {
      if (local_58.size != 0) {
        QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_58);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    ch.ucs = *(char16_t *)(command.m_size + (long)pQVar4 * 2);
    if ((uint)(ushort)ch.ucs == L'\"') {
      iVar2 = iVar2 + 1;
      if (iVar2 == 3) {
        QString::append((QString *)&local_58,(QChar)0x22);
        goto LAB_003cda9c;
      }
    }
    else {
      bVar3 = (bool)(bVar3 ^ iVar2 == 1);
      if (!bVar3) {
        bVar1 = QChar::isSpace((uint)(ushort)ch.ucs);
        if (bVar1) {
          if (local_58.size != 0) {
            QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_58)
            ;
            QString::clear((QString *)&local_58);
          }
          bVar3 = false;
          goto LAB_003cda9c;
        }
      }
      QString::append((QString *)&local_58,ch);
LAB_003cda9c:
      iVar2 = 0;
    }
    pQVar4 = (QProcess *)((long)&(pQVar4->super_QIODevice).super_QObject._vptr_QObject + 1);
  } while( true );
}

Assistant:

QStringList QProcess::splitCommand(QStringView command)
{
    QStringList args;
    QString tmp;
    int quoteCount = 0;
    bool inQuote = false;

    // handle quoting. tokens can be surrounded by double quotes
    // "hello world". three consecutive double quotes represent
    // the quote character itself.
    for (int i = 0; i < command.size(); ++i) {
        if (command.at(i) == u'"') {
            ++quoteCount;
            if (quoteCount == 3) {
                // third consecutive quote
                quoteCount = 0;
                tmp += command.at(i);
            }
            continue;
        }
        if (quoteCount) {
            if (quoteCount == 1)
                inQuote = !inQuote;
            quoteCount = 0;
        }
        if (!inQuote && command.at(i).isSpace()) {
            if (!tmp.isEmpty()) {
                args += tmp;
                tmp.clear();
            }
        } else {
            tmp += command.at(i);
        }
    }
    if (!tmp.isEmpty())
        args += tmp;

    return args;
}